

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::rotate_node_left(Patch *this,Node *pivot,Node *root,Node *root_parent)

{
  Point local_48;
  Point local_40;
  Point local_38;
  Point local_30;
  Node *local_28;
  Node *root_parent_local;
  Node *root_local;
  Node *pivot_local;
  Patch *this_local;
  
  if (root_parent == (Node *)0x0) {
    this->root = pivot;
  }
  else if (root_parent->left == root) {
    root_parent->left = pivot;
  }
  else {
    root_parent->right = pivot;
  }
  root->right = pivot->left;
  pivot->left = root;
  local_28 = root_parent;
  root_parent_local = root;
  root_local = pivot;
  pivot_local = (Node *)this;
  local_38 = Point::traverse(&root->old_distance_from_left_ancestor,&root->old_extent);
  local_30 = Point::traverse(&local_38,&root_local->old_distance_from_left_ancestor);
  root_local->old_distance_from_left_ancestor = local_30;
  local_48 = Point::traverse(&root_parent_local->new_distance_from_left_ancestor,
                             &root_parent_local->new_extent);
  local_40 = Point::traverse(&local_48,&root_local->new_distance_from_left_ancestor);
  root_local->new_distance_from_left_ancestor = local_40;
  Node::compute_subtree_text_sizes(root_parent_local);
  Node::compute_subtree_text_sizes(root_local);
  return;
}

Assistant:

void Patch::rotate_node_left(Node *pivot, Node *root, Node *root_parent) {
  if (root_parent) {
    if (root_parent->left == root) {
      root_parent->left = pivot;
    } else {
      root_parent->right = pivot;
    }
  } else {
    this->root = pivot;
  }

  root->right = pivot->left;
  pivot->left = root;

  pivot->old_distance_from_left_ancestor =
      root->old_distance_from_left_ancestor.traverse(root->old_extent)
          .traverse(pivot->old_distance_from_left_ancestor);
  pivot->new_distance_from_left_ancestor =
      root->new_distance_from_left_ancestor.traverse(root->new_extent)
          .traverse(pivot->new_distance_from_left_ancestor);

  root->compute_subtree_text_sizes();
  pivot->compute_subtree_text_sizes();
}